

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O0

void __thiscall
http_request_line_parsing_simple01_Test::TestBody(http_request_line_parsing_simple01_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  Message local_98;
  http_version local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70 [3];
  http_request_method local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  http_request_line request_line;
  sub_string str;
  http_request_line_parsing_simple01_Test *this_local;
  
  join_0x00000010_0x00000000_ = sub_string::literal<21ul>((char (*) [21])"OPTIONS * HTTP/1.1\r\n");
  parse_request_line((http_request_line *)&gtest_ar.message_,(sub_string *)&request_line.version);
  local_54 = OPTIONS;
  testing::internal::EqHelper<false>::Compare<http_request_method,http_request_method>
            ((EqHelper<false> *)local_50,"request_line.method","http_request_method::OPTIONS",
             (http_request_method *)&gtest_ar.message_,&local_54);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_8c = HTTP_11;
  testing::internal::EqHelper<false>::Compare<http_version,http_version>
            ((EqHelper<false> *)local_88,"request_line.version","http_version::HTTP_11",
             (http_version *)&request_line.uri.end_,&local_8c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  bVar1 = sub_string::empty((sub_string *)&request_line.version);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_b0,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)local_b0,(AssertionResult *)0x1870b9,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  return;
}

Assistant:

TEST(http_request_line_parsing, simple01)
{
    sub_string str = sub_string::literal("OPTIONS * HTTP/1.1\r\n");
    http_request_line request_line = parse_request_line(str);
    EXPECT_EQ(request_line.method, http_request_method::OPTIONS);
    EXPECT_EQ(request_line.version, http_version::HTTP_11);
    EXPECT_TRUE(str.empty());
}